

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O0

void __thiscall
miniros::ServiceClientLink::onResponseWritten(ServiceClientLink *this,ConnectionPtr *conn)

{
  element_type *this_00;
  element_type *__nbytes;
  function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
  *in_RDI;
  anon_class_8_1_8991fb9c *__f;
  anon_class_8_1_8991fb9c local_30 [6];
  
  if (((ulong)in_RDI[1]._M_invoker & 1) == 0) {
    std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x4a74cc);
    Connection::drop((Connection *)this,conn._4_4_);
  }
  else {
    this_00 = std::
              __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4a745c);
    __f = local_30;
    __nbytes = this_00;
    std::
    function<void(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)>
    ::
    function<miniros::ServiceClientLink::onResponseWritten(std::shared_ptr<miniros::Connection>const&)::__0,void>
              (in_RDI,__f);
    Connection::read(this_00,4,__f,(size_t)__nbytes);
    std::
    function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
    ::~function((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                 *)0x4a74a2);
  }
  return;
}

Assistant:

void ServiceClientLink::onResponseWritten(const ConnectionPtr& conn)
{
  (void)conn;
  MINIROS_ASSERT(conn == connection_);

  if (persistent_)
  {
    connection_->read(4,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
        this->onRequestLength(conn, buffer, size, success);
      });
  }
  else
  {
    connection_->drop(Connection::Destructing);
  }
}